

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator08buggy.cpp
# Opt level: O1

void __thiscall Token_stream::ignore(Token_stream *this,char c)

{
  bool bVar1;
  char cVar2;
  
  bVar1 = this->full;
  cVar2 = (this->buffer).kind;
  this->full = false;
  if (bVar1 != true) goto LAB_001029c4;
  do {
    if (cVar2 == c) {
      return;
    }
LAB_001029c4:
    cVar2 = std::istream::get();
  } while (cVar2 != '\n');
  return;
}

Assistant:

void Token_stream::ignore(char c)
{
	if (full && c == buffer.kind)
	{
		full = false;
		return;
	}
	full = false;

	char ch;
	while (true)
	{
		ch = is.get();
		if (ch == c || ch == '\n')
			return;
	}
}